

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<double_*>::TPZVec(TPZVec<double_*> *this,initializer_list<double_*> *list)

{
  ulong uVar1;
  iterator ppdVar2;
  double **ppdVar3;
  long lVar4;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649168;
  this->fStore = (double **)0x0;
  uVar1 = list->_M_len;
  if (uVar1 == 0) {
    ppdVar3 = (double **)0x0;
  }
  else {
    ppdVar3 = (double **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    this->fStore = ppdVar3;
  }
  ppdVar2 = list->_M_array;
  for (lVar4 = 0; uVar1 * 8 - lVar4 != 0; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)ppdVar3 + lVar4) = *(undefined8 *)((long)ppdVar2 + lVar4);
  }
  this->fNElements = uVar1;
  this->fNAlloc = uVar1;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}